

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrAllocSimInfo(int nEntries,int nWords)

{
  void **ppvVar1;
  ulong uVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  long lVar5;
  
  ppvVar1 = (void **)malloc(((long)nWords * 4 + 8) * (long)nEntries);
  uVar2 = 0;
  uVar4 = 0;
  if (0 < nEntries) {
    uVar4 = (ulong)(uint)nEntries;
  }
  lVar5 = (long)nEntries << 3;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    ppvVar1[uVar2] = (void *)((long)ppvVar1 + lVar5);
    lVar5 = lVar5 + (long)nWords * 4;
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = nEntries;
  pVVar3->nCap = nEntries;
  pVVar3->pArray = ppvVar1;
  return pVVar3;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocSimInfo( int nEntries, int nWords )
{
    void ** pMemory;
    unsigned * pInfo;
    int i;
    pMemory = (void **)ABC_ALLOC( char, (sizeof(void *) + sizeof(unsigned) * (size_t)nWords) * nEntries );
    pInfo = (unsigned *)(pMemory + nEntries);
    for ( i = 0; i < nEntries; i++ )
        pMemory[i] = pInfo + i * nWords;
    return Vec_PtrAllocArray( pMemory, nEntries );
}